

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QList<QString>>::emplace<QList<QString>>
          (QMovableArrayOps<QList<QString>> *this,qsizetype i,QList<QString> *args)

{
  Data *pDVar1;
  QString *pQVar2;
  long lVar3;
  qsizetype qVar4;
  QTypedArrayData<QString> *__old_val;
  QString *__old_val_1;
  long in_FS_OFFSET;
  Inserter local_80;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int **)this != (int *)0x0) && (**(int **)this < 2)) {
    if (*(long *)(this + 0x10) == i) {
      qVar4 = QArrayDataPointer<QList<QString>_>::freeSpaceAtEnd
                        ((QArrayDataPointer<QList<QString>_> *)this);
      if (qVar4 == 0) goto LAB_0010b6a9;
      QArrayDataPointer<QString>::QArrayDataPointer
                ((QArrayDataPointer<QString> *)(*(long *)(this + 0x10) * 0x18 + *(long *)(this + 8))
                 ,&args->d);
LAB_0010b7e4:
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
      goto LAB_0010b79f;
    }
LAB_0010b6a9:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QList<QString>_>::freeSpaceAtBegin
                        ((QArrayDataPointer<QList<QString>_> *)this);
      if (qVar4 != 0) {
        QArrayDataPointer<QString>::QArrayDataPointer
                  ((QArrayDataPointer<QString> *)(*(long *)(this + 8) + -0x18),&args->d);
        *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
        goto LAB_0010b7e4;
      }
    }
  }
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  pDVar1 = (args->d).d;
  pQVar2 = (args->d).ptr;
  (args->d).d = (Data *)0x0;
  (args->d).ptr = (QString *)0x0;
  qVar4 = (args->d).size;
  (args->d).size = 0;
  lVar3 = *(long *)(this + 0x10);
  QArrayDataPointer<QList<QString>_>::detachAndGrow
            ((QArrayDataPointer<QList<QString>_> *)this,(uint)(i == 0 && lVar3 != 0),1,
             (QList<QString> **)0x0,(QArrayDataPointer<QList<QString>_> *)0x0);
  if (i == 0 && lVar3 != 0) {
    lVar3 = *(long *)(this + 8);
    *(Data **)(lVar3 + -0x18) = pDVar1;
    *(QString **)(lVar3 + -0x10) = pQVar2;
    *(qsizetype *)(lVar3 + -8) = qVar4;
    *(long *)(this + 8) = lVar3 + -0x18;
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    QMovableArrayOps<QList<QString>_>::Inserter::Inserter
              (&local_80,(QArrayDataPointer<QList<QString>_> *)this,i,1);
    ((local_80.displaceFrom)->d).d = pDVar1;
    ((local_80.displaceFrom)->d).ptr = pQVar2;
    ((local_80.displaceFrom)->d).size = qVar4;
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  local_58.size = 0;
  local_58.ptr = (QString *)0x0;
  local_58.d = (Data *)0x0;
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
LAB_0010b79f:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }